

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  string flagfile_value;
  string arg_string;
  undefined1 local_78 [32];
  char **local_58;
  string local_50;
  
  local_78._0_8_ = local_78 + 0x10;
  local_78._8_8_ = 0;
  local_78[0x10] = '\0';
  _Var4._M_p = (pointer)argc;
  if (1 < *argc) {
    local_58 = argv + 1;
    iVar5 = 1;
    do {
      StreamableToString<char*>(&local_50,(internal *)(argv + iVar5),in_RDX);
      _Var4._M_p = local_50._M_dataplus._M_p;
      bVar1 = ParseGoogleTestFlag(local_50._M_dataplus._M_p);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_00131109:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = local_58 + iVar5;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseFlag<std::__cxx11::string>
                          (_Var4._M_p,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
          LoadFlagsFromFile((string *)local_78._0_8_);
          in_RDX = extraout_RDX_00;
          goto LAB_00131109;
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        in_RDX = extraout_RDX_01;
        if (iVar2 == 0) {
LAB_00131190:
          g_help_flag = '\x01';
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          in_RDX = extraout_RDX_02;
          if (iVar2 == 0) goto LAB_00131190;
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          in_RDX = extraout_RDX_03;
          if (iVar2 == 0) goto LAB_00131190;
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          in_RDX = extraout_RDX_04;
          if (iVar2 == 0) goto LAB_00131190;
          bVar1 = HasGoogleTestFlagPrefix((char *)0x13118c);
          in_RDX = extraout_RDX_05;
          if (bVar1) goto LAB_00131190;
        }
      }
      _Var4._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_06;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var4._M_p);
  }
  if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  return;
}

Assistant:

static const char* GetDefaultFilter() {
  const char* const testbridge_test_only =
      internal::posix::GetEnv("TESTBRIDGE_TEST_ONLY");
  if (testbridge_test_only != nullptr) {
    return testbridge_test_only;
  }
  return kUniversalFilter;
}